

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

QRect __thiscall
QTreeViewPrivate::visualRect(QTreeViewPrivate *this,QModelIndex *index,RectRule rule)

{
  bool bVar1;
  char cVar2;
  uint item;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  QWidget *pQVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  QRect QVar13;
  
  uVar11 = 0xffffffff00000000;
  uVar10 = 0xffffffff;
  pQVar9 = *(QWidget **)
            &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
             super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  bVar1 = QAbstractItemViewPrivate::isIndexValid(&this->super_QAbstractItemViewPrivate,index);
  if (bVar1) {
    cVar2 = (**(code **)(*(long *)pQVar9 + 0x2c0))(pQVar9,index);
    if ((rule == FullRow) || (cVar2 == '\0')) {
      QAbstractItemViewPrivate::executePostedLayout(&this->super_QAbstractItemViewPrivate);
      item = viewIndex(this,index);
      if (-1 < (int)item) {
        iVar7 = index->c;
        if (((this->viewItems).d.ptr[item].field_0x1c & 2) == 0) {
          uVar3 = QTreeView::columnViewportPosition((QTreeView *)pQVar9,iVar7);
          iVar4 = QTreeView::columnWidth((QTreeView *)pQVar9,iVar7);
        }
        else {
          iVar4 = QHeaderView::length(this->header);
          uVar3 = 0;
        }
        iVar5 = logicalIndexForTree(this);
        if (iVar5 == iVar7) {
          if (rule == FullRow) {
LAB_005409b7:
            pQVar9 = QAbstractScrollArea::viewport((QAbstractScrollArea *)pQVar9);
            iVar4 = ((pQVar9->data->crect).x2.m_i - (pQVar9->data->crect).x1.m_i) + 1;
            uVar3 = 0;
          }
          else if (rule == SingleSection || 0 < iVar7) {
            iVar5 = indentationForItem(this,item);
            iVar4 = iVar4 - iVar5;
            bVar1 = QWidget::isRightToLeft(pQVar9);
            iVar7 = 0;
            if (!bVar1) {
              iVar7 = iVar5;
            }
            uVar3 = iVar7 + uVar3;
          }
        }
        else if (rule == FullRow) goto LAB_005409b7;
        uVar6 = coordinateForItem(this,item);
        iVar7 = itemHeight(this,item);
        uVar10 = (ulong)((uVar3 + iVar4) - 1);
        uVar12 = (ulong)uVar6 << 0x20;
        uVar8 = (ulong)uVar3;
        uVar11 = (ulong)((uVar6 + iVar7) - 1) << 0x20;
        goto LAB_00540932;
      }
    }
  }
  uVar12 = 0;
  uVar8 = 0;
LAB_00540932:
  QVar13.x2.m_i = (int)(uVar11 | uVar10);
  QVar13.y2.m_i = (int)((uVar11 | uVar10) >> 0x20);
  QVar13.x1.m_i = (int)(uVar12 | uVar8);
  QVar13.y1.m_i = (int)((uVar12 | uVar8) >> 0x20);
  return QVar13;
}

Assistant:

QRect QTreeViewPrivate::visualRect(const QModelIndex &index, RectRule rule) const
{
    Q_Q(const QTreeView);

    if (!isIndexValid(index))
        return QRect();

    // Calculate the entire row's rectangle, even if one of the elements is hidden
    if (q->isIndexHidden(index) && rule != FullRow)
        return QRect();

    executePostedLayout();

    const int viewIndex = this->viewIndex(index);
    if (viewIndex < 0)
        return QRect();

    const bool spanning = viewItems.at(viewIndex).spanning;
    const int column = index.column();

    // if we have a spanning item, make the selection stretch from left to right
    int x = (spanning ? 0 : q->columnViewportPosition(column));
    int width = (spanning ? header->length() : q->columnWidth(column));

    const bool addIndentation = isTreePosition(column) && (column > 0 || rule == SingleSection);

    if (rule == FullRow) {
        x = 0;
        width = q->viewport()->width();
    } else if (addIndentation) {
        // calculate indentation
        const int indentation = indentationForItem(viewIndex);
        width -= indentation;
        if (!q->isRightToLeft())
            x += indentation;
    }

    const int y = coordinateForItem(viewIndex);
    const int height = itemHeight(viewIndex);

    return QRect(x, y, width, height);
}